

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppm_image.hpp
# Opt level: O2

void __thiscall sisl::utility::ppm_image::ppm_image(ppm_image *this,int *width,int *height)

{
  Matrix<double,__1,_1,_0,__1,_1> *dst;
  int i;
  uint d0;
  int j;
  ulong uVar1;
  vector z;
  Matrix<double,__1,_1,_0,__1,_1> local_48;
  int local_34;
  
  array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::array_n(&this->m_aArray,*width,(ulong)(uint)*height);
  this->m_iHeight = *height;
  this->m_iWidth = *width;
  local_34 = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_48,&local_34);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_48);
  for (d0 = 0; (int)d0 < *width; d0 = d0 + 1) {
    for (uVar1 = 0; (int)uVar1 < *height; uVar1 = (ulong)((int)uVar1 + 1)) {
      dst = array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::operator()(&this->m_aArray,d0,uVar1);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (dst,&local_48);
    }
  }
  free(local_48.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

ppm_image(const int &width, const int &height) : m_iHeight(height),
                                                             m_iWidth(width),
                                                             m_aArray(width, height) {
                // Clear out the internal memory
                vector z(3);
                z.setZero();

                for(int i = 0; i < width; i++) {
                    for(int j = 0; j < height; j++) {
                        m_aArray(i,j) = z;
                    }
                }
            }